

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusconnectioninterface.cpp
# Opt level: O0

int __thiscall
QDBusConnectionInterface::qt_metacall(QDBusConnectionInterface *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  void **in_stack_00000068;
  int in_stack_00000070;
  Call in_stack_00000074;
  QObject *in_stack_00000078;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QDBusAbstractInterface::qt_metacall
                    ((QDBusAbstractInterface *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,in_EDX));
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 0x12) {
        qt_static_metacall(in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
      }
      iVar1 = iVar1 + -0x12;
    }
    if (in_ESI == 7) {
      if (iVar1 < 0x12) {
        qt_static_metacall(in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
      }
      iVar1 = iVar1 + -0x12;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
      iVar1 = iVar1 + -2;
    }
  }
  return iVar1;
}

Assistant:

int QDBusConnectionInterface::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDBusAbstractInterface::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 18)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 18;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 18)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 18;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}